

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  undefined8 *mem;
  N_Vector w;
  N_Vector y0;
  N_Vector p_Var4;
  N_Vector flagvalue;
  SUNMatrix flagvalue_00;
  SUNNonlinearSolver NLS;
  int iVar5;
  char *__s;
  int local_5c;
  SUNLinearSolver local_58;
  N_Vector local_50;
  SUNMatrix local_48;
  N_Vector local_40;
  long niters;
  
  mem = (undefined8 *)malloc(0x18);
  w = (N_Vector)N_VNew_Serial(3);
  iVar3 = check_retval(w,"N_VNew_Serial",0);
  iVar5 = 1;
  if (iVar3 == 0) {
    y0 = N_VClone(w);
    iVar3 = check_retval(y0,"N_VNew_Serial",0);
    if (iVar3 == 0) {
      p_Var4 = N_VClone(w);
      iVar3 = check_retval(p_Var4,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        flagvalue = N_VClone(w);
        iVar3 = check_retval(flagvalue,"N_VNew_Serial",0);
        if (iVar3 == 0) {
          puVar1 = *(undefined8 **)((long)y0->content + 0x10);
          *puVar1 = 0x3fe0000000000000;
          puVar1[1] = 0x3fe0000000000000;
          puVar1[2] = 0x3fe0000000000000;
          puVar2 = *(undefined4 **)((long)flagvalue->content + 0x10);
          *puVar2 = 0;
          puVar2[1] = 0x3ff00000;
          puVar2[2] = 0;
          puVar2[3] = 0x3ff00000;
          *(undefined8 *)(puVar2 + 4) = 0x3ff0000000000000;
          local_40 = p_Var4;
          flagvalue_00 = (SUNMatrix)SUNDenseMatrix(3,3);
          iVar3 = check_retval(flagvalue_00,"SUNDenseMatrix",0);
          p_Var4 = local_40;
          if (iVar3 == 0) {
            local_50 = flagvalue;
            local_58 = (SUNLinearSolver)SUNLinSol_Dense(local_40,flagvalue_00);
            iVar3 = check_retval(local_58,"SUNLinSol_Dense",0);
            if (iVar3 == 0) {
              local_5c = SUNLinSolInitialize(local_58);
              iVar3 = check_retval(&local_5c,"SUNLinSolInitialize",1);
              iVar5 = 1;
              if (iVar3 == 0) {
                *mem = w;
                mem[1] = flagvalue_00;
                mem[2] = local_58;
                local_48 = flagvalue_00;
                NLS = (SUNNonlinearSolver)SUNNonlinSol_Newton(p_Var4);
                iVar3 = check_retval(NLS,"SUNNonlinSol_Newton",0);
                if (iVar3 == 0) {
                  local_5c = SUNNonlinSolSetSysFn(NLS,Res);
                  iVar3 = check_retval(&local_5c,"SUNNonlinSolSetSysFn",1);
                  iVar5 = 1;
                  if (iVar3 == 0) {
                    local_5c = SUNNonlinSolSetLSetupFn(NLS,LSetup);
                    iVar3 = check_retval(&local_5c,"SUNNonlinSolSetSetupFn",1);
                    iVar5 = 1;
                    if (iVar3 == 0) {
                      local_5c = SUNNonlinSolSetLSolveFn(NLS,LSolve);
                      iVar3 = check_retval(&local_5c,"SUNNonlinSolSetSolveFn",1);
                      iVar5 = 1;
                      if (iVar3 == 0) {
                        local_5c = SUNNonlinSolSetConvTestFn(NLS,ConvTest);
                        iVar3 = check_retval(&local_5c,"SUNNonlinSolSetConvTestFn",1);
                        iVar5 = 1;
                        if (iVar3 == 0) {
                          local_5c = SUNNonlinSolSetMaxIters(NLS,10);
                          iVar3 = check_retval(&local_5c,"SUNNonlinSolSetMaxIters",1);
                          iVar5 = 1;
                          if (iVar3 == 0) {
                            local_5c = SUNNonlinSolSolve(NLS,y0,p_Var4,local_50,0.01,1,mem);
                            iVar3 = check_retval(&local_5c,"SUNNonlinSolSolve",1);
                            iVar5 = 1;
                            if (iVar3 == 0) {
                              puts("Solution:");
                              printf("y1 = %g\n",
                                     (int)**(undefined8 **)((long)p_Var4->content + 0x10));
                              printf("y2 = %g\n",
                                     (int)*(undefined8 *)
                                           (*(long *)((long)p_Var4->content + 0x10) + 8));
                              printf("y3 = %g\n",
                                     (int)*(undefined8 *)
                                           (*(long *)((long)p_Var4->content + 0x10) + 0x10));
                              puts("Solution Error:");
                              printf("e1 = %g\n",
                                     SUB84(**(double **)((long)p_Var4->content + 0x10) +
                                           -0.7851969330623553,0));
                              printf("e2 = %g\n",
                                     SUB84(*(double *)(*(long *)((long)p_Var4->content + 0x10) + 8)
                                           + -0.4966113929446564,0));
                              printf("e3 = %g\n",
                                     SUB84(*(double *)
                                            (*(long *)((long)p_Var4->content + 0x10) + 0x10) +
                                           -0.36992283074587234,0));
                              local_5c = SUNNonlinSolGetNumIters(NLS,&niters);
                              iVar3 = check_retval(&local_5c,"SUNNonlinSolGetNumIters",1);
                              iVar5 = 1;
                              if (iVar3 == 0) {
                                printf("Number of nonlinear iterations: %ld\n",niters);
                                N_VDestroy(w);
                                N_VDestroy(y0);
                                N_VDestroy(p_Var4);
                                N_VDestroy(local_50);
                                SUNMatDestroy(local_48);
                                SUNLinSolFree(local_58);
                                SUNNonlinSolFree(NLS);
                                free(mem);
                                __s = "FAIL";
                                if (local_5c == 0) {
                                  __s = "SUCCESS";
                                }
                                puts(__s);
                                iVar5 = local_5c;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char *argv[]) 
{
  int                retval = 0;
  N_Vector           x, y0, y, w;
  SUNMatrix          A;
  SUNLinearSolver    LS;
  SUNNonlinearSolver NLS;
  IntegratorMem      Imem;
  long int           niters;
  
  /* create integrator memory */
  Imem = (IntegratorMem) malloc(sizeof(struct IntegratorMemRec));

  /* create vector */
  x  = N_VNew_Serial(NEQ);
  if (check_retval((void *)x, "N_VNew_Serial", 0)) return(1);

  y0 = N_VClone(x);
  if (check_retval((void *)y0, "N_VNew_Serial", 0)) return(1);

  y  = N_VClone(x);
  if (check_retval((void *)y, "N_VNew_Serial", 0)) return(1);

  w  = N_VClone(x);
  if (check_retval((void *)w, "N_VNew_Serial", 0)) return(1);

  /* set initial guess */
  NV_Ith_S(y0,0) = HALF;
  NV_Ith_S(y0,1) = HALF;
  NV_Ith_S(y0,2) = HALF;

  /* set weights */
  NV_Ith_S(w,0) = ONE;
  NV_Ith_S(w,1) = ONE;
  NV_Ith_S(w,2) = ONE;
  
  /* create dense matrix */
  A = SUNDenseMatrix(NEQ, NEQ);
  if (check_retval((void *)A, "SUNDenseMatrix", 0)) return(1);

  /* create dense linear solver */
  LS  = SUNLinSol_Dense(y, A);
  if (check_retval((void *)LS, "SUNLinSol_Dense", 0)) return(1);

  /* initialize the linear solver */
  retval = SUNLinSolInitialize(LS);
  if (check_retval(&retval, "SUNLinSolInitialize", 1)) return(1);

  /* set integrator memory */
  Imem->x  = x;
  Imem->A  = A;
  Imem->LS = LS;

  /* create nonlinear solver */
  NLS = SUNNonlinSol_Newton(y);
  if (check_retval((void *)NLS, "SUNNonlinSol_Newton", 0)) return(1);

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(NLS, Res);
  if (check_retval(&retval, "SUNNonlinSolSetSysFn", 1)) return(1);

  /* set the wrapper functions to linear solver setup and solve functions */
  retval = SUNNonlinSolSetLSetupFn(NLS, LSetup);
  if (check_retval(&retval, "SUNNonlinSolSetSetupFn", 1)) return(1);

  retval = SUNNonlinSolSetLSolveFn(NLS, LSolve);
  if (check_retval(&retval, "SUNNonlinSolSetSolveFn", 1)) return(1);

  retval = SUNNonlinSolSetConvTestFn(NLS, ConvTest);
  if (check_retval(&retval, "SUNNonlinSolSetConvTestFn", 1)) return(1);

  /* set the maximum number of nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(NLS, MAXIT);
  if (check_retval(&retval, "SUNNonlinSolSetMaxIters", 1)) return(1);

  /* solve the nonlinear system */
  retval = SUNNonlinSolSolve(NLS, y0, y, w, TOL, SUNTRUE, Imem);
  if (check_retval(&retval, "SUNNonlinSolSolve", 1)) return(1);

  /* print the solution */
  printf("Solution:\n");
  printf("y1 = %g\n",NV_Ith_S(y,0));
  printf("y2 = %g\n",NV_Ith_S(y,1));
  printf("y3 = %g\n",NV_Ith_S(y,2));

  /* print the solution error */
  printf("Solution Error:\n");
  printf("e1 = %g\n",NV_Ith_S(y,0) - Y1);
  printf("e2 = %g\n",NV_Ith_S(y,1) - Y2);
  printf("e3 = %g\n",NV_Ith_S(y,2) - Y3);

  /* get the number of linear iterations */
  retval = SUNNonlinSolGetNumIters(NLS, &niters);
  if (check_retval(&retval, "SUNNonlinSolGetNumIters", 1)) return(1);

  printf("Number of nonlinear iterations: %ld\n",niters);

  /* Free vector, matrix, linear solver, and nonlinear solver */
  N_VDestroy(x);
  N_VDestroy(y0);
  N_VDestroy(y);
  N_VDestroy(w);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  SUNNonlinSolFree(NLS);
  free(Imem);

  /* Print result */
  if (retval) {
    printf("FAIL\n");
  } else {
    printf("SUCCESS\n");
  }

  return(retval);
}